

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_transform *
sample_keyframe_transform
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_keyframe_transform *keyframes,
          uint32_t num_keyframes,bool loop,uint32_t frame_index)

{
  int iVar1;
  float fVar2;
  float fVar3;
  ogt_vox_transform *next_transform;
  float t_inv;
  float t;
  uint32_t curr_frame;
  uint32_t next_frame;
  int32_t f;
  uint32_t frame_index_local;
  bool loop_local;
  uint32_t num_keyframes_local;
  ogt_vox_keyframe_transform *keyframes_local;
  
  if (num_keyframes == 0) {
    __assert_fail("(num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                  ,0x4f3,
                  "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                 );
  }
  next_frame = frame_index;
  if (loop) {
    next_frame = compute_looped_frame_index
                           (keyframes->frame_index,keyframes[num_keyframes - 1].frame_index,
                            frame_index);
  }
  if (keyframes->frame_index < next_frame) {
    if (next_frame < keyframes[num_keyframes - 1].frame_index) {
      curr_frame = num_keyframes - 2;
      while( true ) {
        if ((int)curr_frame < 0) {
          __assert_fail("(0) && (\"shouldn\'t reach here\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                        ,0x50d,
                        "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                       );
        }
        if (keyframes[(int)curr_frame].frame_index <= next_frame) break;
        curr_frame = curr_frame - 1;
      }
      fVar2 = (float)(next_frame - keyframes[(int)curr_frame].frame_index) /
              (float)(keyframes[(int)(curr_frame + 1)].frame_index -
                     keyframes[(int)curr_frame].frame_index);
      fVar3 = 1.0 - fVar2;
      memcpy(__return_storage_ptr__,&keyframes[(int)curr_frame].transform,0x40);
      iVar1 = curr_frame + 1;
      __return_storage_ptr__->m30 =
           (float)(int)(keyframes[iVar1].transform.m30 * fVar2 + __return_storage_ptr__->m30 * fVar3
                       );
      __return_storage_ptr__->m31 =
           (float)(int)(keyframes[iVar1].transform.m31 * fVar2 + __return_storage_ptr__->m31 * fVar3
                       );
      __return_storage_ptr__->m32 =
           (float)(int)(keyframes[iVar1].transform.m32 * fVar2 + __return_storage_ptr__->m32 * fVar3
                       );
    }
    else {
      memcpy(__return_storage_ptr__,&keyframes[num_keyframes - 1].transform,0x40);
    }
  }
  else {
    memcpy(__return_storage_ptr__,&keyframes->transform,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform* keyframes, uint32_t num_keyframes, bool loop, uint32_t frame_index)
    {
        ogt_assert(num_keyframes >= 1, "need at least one keyframe to sample");
        if (loop) {
            frame_index = compute_looped_frame_index(keyframes[0].frame_index, keyframes[num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= keyframes[0].frame_index)
            return keyframes[0].transform;
        if (frame_index >= keyframes[num_keyframes-1].frame_index)
            return keyframes[num_keyframes-1].transform;
        for (int32_t f = (int32_t)num_keyframes-2; f >= 0; f--) {
            if (frame_index >= keyframes[f].frame_index) {
                // orientation always snaps
                uint32_t next_frame = keyframes[f+1].frame_index;
                uint32_t curr_frame = keyframes[f+0].frame_index;
                float t = (frame_index - curr_frame)  / (float)(next_frame - curr_frame);
                float t_inv = 1.0f - t;
                // orientation always snaps to the earlier frame
                ogt_vox_transform curr_transform = keyframes[f+0].transform;
                // position gets interpolated with rounding towards zero - TODO(jpaver) or should it be -INF?
                const ogt_vox_transform& next_transform = keyframes[f+1].transform;
                curr_transform.m30 = (float)(int32_t)((next_transform.m30 * t) + (curr_transform.m30 * t_inv));
                curr_transform.m31 = (float)(int32_t)((next_transform.m31 * t) + (curr_transform.m31 * t_inv));
                curr_transform.m32 = (float)(int32_t)((next_transform.m32 * t) + (curr_transform.m32 * t_inv));
                return curr_transform;

            }
        }
        ogt_assert(0, "shouldn't reach here");
        return keyframes[0].transform;
    }